

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O0

void write_parser_tables(Grammar *g,char *tag,File *file)

{
  Production *pPVar1;
  char *pcVar2;
  OffsetEntry *pOVar3;
  FILE *pFVar4;
  Production *p;
  VecState er_hash;
  int whitespace_production;
  File *file_local;
  char *tag_local;
  Grammar *g_local;
  
  er_hash.e[2]._4_4_ = 0;
  p._0_4_ = 0;
  er_hash.n = 0;
  er_hash.i = 0;
  g->scanner_block_size = (int)(0x100 / (long)g->scanner_blocks);
  write_reductions(file,g,tag);
  write_scanner_data(file,g,tag);
  if (file->binary == 0) {
    write_scanner_code(file,g,tag);
  }
  write_goto_data(file,g,tag);
  write_error_data(file,g,(VecState *)&p,tag);
  write_state_data(file,g,(VecState *)&p,tag);
  write_symbol_data(file,g,tag);
  write_passes(file,g,tag);
  if ((er_hash._0_8_ != 0) && ((State ***)er_hash._0_8_ != &er_hash.v)) {
    free((void *)er_hash._0_8_);
  }
  p._0_4_ = 0;
  er_hash.n = 0;
  er_hash.i = 0;
  pPVar1 = lookup_production(g,"whitespace",10);
  if (pPVar1 != (Production *)0x0) {
    er_hash.e[2]._4_4_ = pPVar1->state->index;
  }
  if (file->binary != 0) {
    file->d_parser_tables_loc = (int)(file->tables).cur - (int)(file->tables).start;
  }
  pcVar2 = make_name("parser_tables_%s",tag);
  start_struct_fn(file,0x48,"D_ParserTables",pcVar2,"\n");
  if (file->binary == 0) {
    handle_comma(file);
    myfprintf(file->fp,"%d",(ulong)(g->states).n);
  }
  else {
    *(uint *)(file->tables).cur = (g->states).n;
  }
  if (file != (File *)0x0) {
    if ((file->tables).cur == (char *)0x0) {
      pOVar3 = get_offset(file,"d_states_%s",tag);
      add_struct_ptr_member_fn(file,(void **)0x0,pOVar3,"%s");
    }
    else {
      pcVar2 = (file->tables).cur;
      pOVar3 = get_offset(file,"d_states_%s",tag);
      add_struct_ptr_member_fn(file,(void **)(pcVar2 + 8),pOVar3,"%s");
    }
  }
  if (file != (File *)0x0) {
    if ((file->tables).cur == (char *)0x0) {
      pOVar3 = get_offset(file,"d_gotos_%s",tag);
      add_struct_ptr_member_fn(file,(void **)0x0,pOVar3,"%s");
    }
    else {
      pcVar2 = (file->tables).cur;
      pOVar3 = get_offset(file,"d_gotos_%s",tag);
      add_struct_ptr_member_fn(file,(void **)(pcVar2 + 0x10),pOVar3,"%s");
    }
  }
  if (file->binary == 0) {
    handle_comma(file);
    myfprintf(file->fp,"%d",(ulong)er_hash.e[2]._4_4_);
  }
  else {
    *(uint *)((file->tables).cur + 0x18) = er_hash.e[2]._4_4_;
  }
  if (file->binary == 0) {
    handle_comma(file);
    myfprintf(file->fp,"%d",(ulong)((g->productions).n + (g->terminals).n));
  }
  else {
    *(uint *)((file->tables).cur + 0x1c) = (g->productions).n + (g->terminals).n;
  }
  if (file != (File *)0x0) {
    if ((file->tables).cur == (char *)0x0) {
      pOVar3 = get_offset(file,"d_symbols_%s",tag);
      add_struct_ptr_member_fn(file,(void **)0x0,pOVar3,"%s");
    }
    else {
      pcVar2 = (file->tables).cur;
      pOVar3 = get_offset(file,"d_symbols_%s",tag);
      add_struct_ptr_member_fn(file,(void **)(pcVar2 + 0x20),pOVar3,"%s");
    }
  }
  if (g->default_white_space == (char *)0x0) {
    if (file != (File *)0x0) {
      if ((file->tables).cur == (char *)0x0) {
        add_struct_ptr_member_fn(file,(void **)0x0,&null_entry,"%s");
      }
      else {
        add_struct_ptr_member_fn(file,(void **)((file->tables).cur + 0x28),&null_entry,"%s");
      }
    }
  }
  else {
    if (file->binary != 0) {
      __assert_fail("!file->binary",
                    "/workspace/llm4binary/github/license_c_cmakelists/jplevyak[P]dparser/write_tables.c"
                    ,0x6a6,"void write_parser_tables(Grammar *, char *, File *)");
    }
    myfprintf(file->fp,", %s",g->default_white_space);
  }
  if (file->binary == 0) {
    handle_comma(file);
    myfprintf(file->fp,"%d",(ulong)(g->passes).n);
  }
  else {
    *(uint *)((file->tables).cur + 0x30) = (g->passes).n;
  }
  if ((g->passes).n == 0) {
    if (file != (File *)0x0) {
      if ((file->tables).cur == (char *)0x0) {
        add_struct_ptr_member_fn(file,(void **)0x0,&null_entry,"%s");
      }
      else {
        add_struct_ptr_member_fn(file,(void **)((file->tables).cur + 0x38),&null_entry,"%s");
      }
    }
  }
  else if (file != (File *)0x0) {
    if ((file->tables).cur == (char *)0x0) {
      pOVar3 = get_offset(file,"d_passes_%s",tag);
      add_struct_ptr_member_fn(file,(void **)0x0,pOVar3,"%s");
    }
    else {
      pcVar2 = (file->tables).cur;
      pOVar3 = get_offset(file,"d_passes_%s",tag);
      add_struct_ptr_member_fn(file,(void **)(pcVar2 + 0x38),pOVar3,"%s");
    }
  }
  if (g->save_parse_tree == 0) {
    if (file->binary == 0) {
      handle_comma(file);
      myfprintf(file->fp,"%d",0);
    }
    else {
      pcVar2 = (file->tables).cur;
      pcVar2[0x40] = '\0';
      pcVar2[0x41] = '\0';
      pcVar2[0x42] = '\0';
      pcVar2[0x43] = '\0';
    }
  }
  else if (file->binary == 0) {
    handle_comma(file);
    myfprintf(file->fp,"%d",1);
  }
  else {
    pcVar2 = (file->tables).cur;
    pcVar2[0x40] = '\x01';
    pcVar2[0x41] = '\0';
    pcVar2[0x42] = '\0';
    pcVar2[0x43] = '\0';
  }
  end_struct_fn(file,0x48,"\n");
  if (file->binary != 0) {
    if (file->str == (uint8 **)0x0) {
      pFVar4 = fopen(g->write_pathname,"wb");
      file->fp = (FILE *)pFVar4;
      if (file->fp == (FILE *)0x0) {
        d_fail("unable to open `%s` for write\n",g->pathname);
      }
    }
    save_binary_tables(file);
  }
  free_tables(file);
  if (file->fp != (FILE *)0x0) {
    fclose((FILE *)file->fp);
  }
  return;
}

Assistant:

void write_parser_tables(Grammar *g, char *tag, File *file) {
  int whitespace_production = 0;
  VecState er_hash;
  Production *p;
  vec_clear(&er_hash);

  g->scanner_block_size = 256 / g->scanner_blocks;

  write_reductions(file, g, tag);
  write_scanner_data(file, g, tag);
  if (!file->binary) write_scanner_code(file, g, tag);
  write_goto_data(file, g, tag);
  write_error_data(file, g, &er_hash, tag);
  write_state_data(file, g, &er_hash, tag);
  write_symbol_data(file, g, tag);
  write_passes(file, g, tag);
  vec_free(&er_hash);

  if ((p = lookup_production(g, "whitespace", sizeof("whitespace") - 1))) whitespace_production = p->state->index;

  if (file->binary) {
    file->d_parser_tables_loc = file->tables.cur - file->tables.start;
  }

  start_struct(file, D_ParserTables, make_name("parser_tables_%s", tag), "\n");
  add_struct_member(file, D_ParserTables, "%d", g->states.n, nstates);
  add_struct_ptr_member(file, D_ParserTables, "", get_offset(file, "d_states_%s", tag), state);
  add_struct_ptr_member(file, D_ParserTables, "", get_offset(file, "d_gotos_%s", tag), goto_table);
  add_struct_member(file, D_ParserTables, "%d", whitespace_production, whitespace_state);
  add_struct_member(file, D_ParserTables, "%d", g->productions.n + g->terminals.n, nsymbols);
  add_struct_ptr_member(file, D_ParserTables, "", get_offset(file, "d_symbols_%s", tag), symbols);
  if (g->default_white_space) {
    assert(!file->binary);
    fprintf(file->fp, ", %s", g->default_white_space);
  } else {
    add_struct_ptr_member(file, D_ParserTables, "", &null_entry, default_white_space);
  }
  add_struct_member(file, D_ParserTables, "%d", g->passes.n, npasses);
  if (g->passes.n){
    add_struct_ptr_member(file, D_ParserTables, "", get_offset(file, "d_passes_%s", tag), passes);
  } else {
    add_struct_ptr_member(file, D_ParserTables, "", &null_entry, passes);
  }
  if (g->save_parse_tree) {
    add_struct_member(file, D_ParserTables, "%d", 1, save_parse_tree);
  } else {
    add_struct_member(file, D_ParserTables, "%d", 0, save_parse_tree);
  }
  end_struct(file, D_ParserTables, "\n");

  if (file->binary) {
    if (!file->str) {
      file->fp = fopen(g->write_pathname, "wb");
      if (!file->fp) d_fail("unable to open `%s` for write\n", g->pathname);
    }
    save_binary_tables(file);
  }
  free_tables(file);
  if (file->fp) fclose(file->fp);
}